

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate.cpp
# Opt level: O1

void __thiscall
QUtcTimeZonePrivate::QUtcTimeZonePrivate(QUtcTimeZonePrivate *this,qint32 offsetSeconds)

{
  long lVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  Data *data;
  qsizetype qVar4;
  int iVar5;
  ushort *puVar6;
  void *pvVar7;
  size_t sVar8;
  ulong uVar9;
  QString *pQVar10;
  ulong uVar11;
  ulong uVar12;
  qsizetype qVar13;
  QArrayData *pQVar14;
  size_t __n;
  char *b;
  char *data_00;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QString local_98;
  QArrayData *local_78;
  char16_t *pcStack_70;
  QString *local_68;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (this->super_QTimeZonePrivate).super_QSharedData.ref.super_QAtomicInteger<int>.
  super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i = 0;
  (this->super_QTimeZonePrivate).m_id.d.d = (Data *)0x0;
  (this->super_QTimeZonePrivate).m_id.d.ptr = (char *)0x0;
  (this->super_QTimeZonePrivate).m_id.d.size = 0;
  (this->super_QTimeZonePrivate)._vptr_QTimeZonePrivate =
       (_func_int **)&PTR__QUtcTimeZonePrivate_006b05d8;
  (this->m_name).d.d = (Data *)0x0;
  (this->m_name).d.ptr = (char16_t *)0x0;
  (this->m_name).d.size = 0;
  (this->m_abbreviation).d.d = (Data *)0x0;
  (this->m_abbreviation).d.ptr = (char16_t *)0x0;
  (this->m_abbreviation).d.size = 0;
  (this->m_comment).d.d = (Data *)0x0;
  (this->m_comment).d.ptr = (char16_t *)0x0;
  (this->m_comment).d.size = 0;
  local_58.d.d = (Data *)0x0;
  local_58.d.ptr = (char16_t *)0x0;
  local_58.d.size = 0;
  local_78 = (QArrayData *)0x0;
  pcStack_70 = (char16_t *)0x0;
  local_68 = (QString *)0x0;
  uVar9 = 0x2a;
  puVar6 = &QtTimeZoneCldr::utcDataTable;
  do {
    uVar11 = uVar9 >> 1;
    uVar12 = ~uVar11 + uVar9;
    uVar9 = uVar11;
    if (*(int *)(puVar6 + uVar11 * 4 + 2) < offsetSeconds) {
      puVar6 = puVar6 + uVar11 * 4 + 4;
      uVar9 = uVar12;
    }
  } while (0 < (long)uVar9);
  if ((puVar6 == (ushort *)"16QTimeZonePrivate") || (*(int *)(puVar6 + 2) != offsetSeconds)) {
    QTimeZonePrivate::isoOffsetFormat(&local_98,offsetSeconds,ShortName);
    pcVar3 = local_58.d.ptr;
    data = local_58.d.d;
    qVar13 = local_98.d.size;
    pDVar2 = local_98.d.d;
    local_98.d.d = local_58.d.d;
    local_58.d.d = pDVar2;
    local_58.d.ptr = local_98.d.ptr;
    local_98.d.ptr = pcVar3;
    local_98.d.size = local_58.d.size;
    local_58.d.size = qVar13;
    if (&data->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (data->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (data->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((data->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&data->super_QArrayData,2,0x10);
      }
    }
    QString::toUtf8_helper((QByteArray *)&local_98,&local_58);
    pcVar3 = pcStack_70;
    pQVar14 = local_78;
    qVar13 = local_98.d.size;
    pDVar2 = local_98.d.d;
    local_98.d.d = (Data *)local_78;
    local_78 = &pDVar2->super_QArrayData;
    pcStack_70 = local_98.d.ptr;
    local_98.d.ptr = pcVar3;
    local_98.d.size = (qsizetype)local_68;
    local_68 = (QString *)qVar13;
    if (pQVar14 == (QArrayData *)0x0) goto LAB_00403f39;
    LOCK();
    (pQVar14->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar14->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar14->ref_)._q_value.super___atomic_base<int>._M_i != 0) goto LAB_00403f39;
    qVar13 = 1;
  }
  else {
    data_00 = "Asia/Kabul" + *puVar6;
    __n = 0xffffffffffffffff;
    do {
      lVar1 = __n + (ulong)*puVar6 + 1;
      __n = __n + 1;
    } while ("Asia/Kabul"[lVar1] != '\0');
    if ((__n == 0) || (pvVar7 = memchr(data_00,0x20,__n), pvVar7 == (void *)0x0)) {
      sVar8 = 0xffffffffffffffff;
    }
    else {
      sVar8 = (long)pvVar7 - (long)data_00;
    }
    if (-1 < (long)sVar8) {
      __n = sVar8;
    }
    if ((__n == 3) && (iVar5 = bcmp(data_00,"UTC",3), pQVar14 = local_78, iVar5 == 0)) {
      local_78 = (QArrayData *)0x0;
      pcStack_70 = L"UTC";
      local_68 = (QString *)0x3;
      if (pQVar14 != (QArrayData *)0x0) {
        LOCK();
        (pQVar14->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar14->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar14->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar14,1,0x10);
        }
      }
      pQVar14 = &(local_58.d.d)->super_QArrayData;
      local_58.d.d = (Data *)0x0;
      local_58.d.ptr = L"UTC";
      local_58.d.size = 3;
      if (pQVar14 == (QArrayData *)0x0) goto LAB_00403f39;
      LOCK();
      (((Data *)pQVar14)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (((Data *)pQVar14)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      iVar5 = (((Data *)pQVar14)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
      UNLOCK();
    }
    else {
      QByteArray::QByteArray((QByteArray *)&local_98,data_00,__n);
      pcVar3 = pcStack_70;
      pQVar14 = local_78;
      pQVar10 = (QString *)local_98.d.size;
      pDVar2 = local_98.d.d;
      local_98.d.d = (Data *)local_78;
      local_78 = &pDVar2->super_QArrayData;
      pcStack_70 = local_98.d.ptr;
      local_98.d.ptr = pcVar3;
      local_98.d.size = (qsizetype)local_68;
      local_68 = pQVar10;
      if (pQVar14 != (QArrayData *)0x0) {
        LOCK();
        (pQVar14->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar14->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar14->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar14,1,0x10);
        }
      }
      ba.m_data = (storage_type *)pQVar10;
      ba.m_size = (qsizetype)pcStack_70;
      QString::fromUtf8(&local_98,local_68,ba);
      qVar4 = local_58.d.size;
      pcVar3 = local_58.d.ptr;
      pQVar14 = &(local_58.d.d)->super_QArrayData;
      qVar13 = local_98.d.size;
      local_58.d.ptr = local_98.d.ptr;
      pDVar2 = local_98.d.d;
      local_98.d.d = local_58.d.d;
      local_58.d.d = pDVar2;
      local_98.d.ptr = pcVar3;
      local_98.d.size = local_58.d.size;
      local_58.d.size = qVar13;
      if (pQVar14 == (QArrayData *)0x0) goto LAB_00403f39;
      LOCK();
      (((Data *)pQVar14)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (((Data *)pQVar14)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      iVar5 = (((Data *)pQVar14)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
      UNLOCK();
      local_98.d.d = (Data *)pQVar14;
      local_98.d.size = qVar4;
    }
    if (iVar5 != 0) goto LAB_00403f39;
    qVar13 = 2;
  }
  QArrayData::deallocate(pQVar14,qVar13,0x10);
LAB_00403f39:
  init(this,(EVP_PKEY_CTX *)&local_78);
  if (local_78 != (QArrayData *)0x0) {
    LOCK();
    (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_78,1,0x10);
    }
  }
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QUtcTimeZonePrivate::QUtcTimeZonePrivate(qint32 offsetSeconds)
{
    QString name;
    QByteArray id;
    // If there's an IANA ID for this offset, use it:
    const auto data = std::lower_bound(std::begin(utcDataTable), std::end(utcDataTable),
                                       offsetSeconds, atLowerUtcOffset);
    if (data != std::end(utcDataTable) && data->offsetFromUtc == offsetSeconds) {
        QByteArrayView ianaId = data->id();
        qsizetype cut = ianaId.indexOf(' ');
        QByteArrayView cutId = (cut < 0 ? ianaId : ianaId.first(cut));
        if (cutId == utcQByteArray()) {
            // optimize: reuse interned strings for the common case
            id = utcQByteArray();
            name = utcQString();
        } else {
            // fallback to allocate new strings otherwise
            id = cutId.toByteArray();
            name = QString::fromUtf8(id);
        }
        Q_ASSERT(!name.isEmpty());
    } else { // Fall back to a UTC-offset name:
        name = isoOffsetFormat(offsetSeconds, QTimeZone::ShortName);
        id = name.toUtf8();
    }
    init(id, offsetSeconds, name, name, QLocale::AnyTerritory, name);
}